

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall
ktx::CommandExtract::unpackAndSave422
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *data,size_t size)

{
  ulong uVar1;
  byte *pbVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  uint32_t i;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar14;
  int iVar15;
  pointer psVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  VkFormat vkFormat_00;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  pointer psVar25;
  uint uVar26;
  uint uVar27;
  uint __tmp;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  byte bVar31;
  byte bVar32;
  uint uVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  uint32_t y0Bits;
  uint32_t local_250;
  uint local_24c;
  uint32_t uBits;
  anon_class_1_0_00000001 interpolateUV;
  anon_class_1_0_00000001 interpolateY;
  ulong local_240;
  ulong local_230;
  int local_200;
  float upper;
  float valueRightV;
  float valueRightU;
  float valueRightY0;
  float valueV;
  float valueU;
  float valueY1;
  float valueY0;
  float valueLeftV;
  float valueLeftU;
  float valueLeftY1;
  float blockSize;
  float positionV;
  float positionU;
  float positionY1;
  float positionY0;
  uint32_t channelBytes;
  ulong local_1b0;
  vector<char,_std::allocator<char>_> unpackedData;
  anon_class_160_20_da61d305 setPixel;
  string local_c0;
  FormatDescriptor unpackedFormat;
  ulong uVar13;
  
  if (*(char *)&format->basic != '\x02') {
    __assert_fail("format.model() == KHR_DF_MODEL_YUVSDA",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x227,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar16 = (format->samples).
            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar25 = psVar16;
  while( true ) {
    if (psVar25 ==
        (format->samples).
        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("format.find(KHR_DF_CHANNEL_YUVSDA_Y)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x228,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    if ((psVar25->field_0x3 & 0xf) == 0) break;
    psVar25 = psVar25 + 1;
  }
  uVar19 = *(ulong *)psVar16;
  uVar8 = (uint)uVar19;
  while ((uVar19 & 0xf000000) != 0) {
    psVar16 = psVar16 + 1;
    uVar19 = *(ulong *)psVar16;
    uVar8 = (uint)uVar19;
  }
  uVar33 = uVar8 >> 0x10 & 0xff;
  uVar18 = uVar33 + 1;
  bVar31 = (byte)(uVar8 >> 0x10);
  if (bVar31 == 7) {
    vkFormat_00 = VK_FORMAT_R8G8B8A8_UNORM;
  }
  else if (uVar33 == 9) {
    vkFormat_00 = VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16;
  }
  else if (uVar33 == 0xb) {
    vkFormat_00 = VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16;
  }
  else {
    vkFormat_00 = VK_FORMAT_R16G16B16A16_UNORM;
    if (uVar18 != 0x10) {
      vkFormat_00 = VK_FORMAT_UNDEFINED;
    }
  }
  createFormatDescriptor(&unpackedFormat,vkFormat_00,&(this->super_Command).super_Reporter);
  FormatDescriptor::removeLastChannel(&unpackedFormat);
  uVar8 = (uint)(byte)(format->basic).field_0x8;
  uVar19 = *(ulong *)&format->basic;
  uVar12 = (uint)(byte)unpackedFormat.basic._8_1_;
  channelBytes = uVar12 / 3;
  psVar16 = (format->samples).
            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar25 = (format->samples).
            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (((long)psVar25 - (long)psVar16 & 0xffffffff0U) != 0x40) {
    __assert_fail("format.sampleCount() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23a,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((uVar19 & 0xff00000000) != 0x100000000) {
    __assert_fail("format.basic.texelBlockDimension0 + 1 == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23b,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((char)(uVar19 >> 0x28) != '\0') {
    __assert_fail("format.basic.texelBlockDimension1 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23c,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((char)(uVar19 >> 0x30) != '\0') {
    __assert_fail("format.basic.texelBlockDimension2 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23d,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (uVar19 >> 0x38 != 0) {
    __assert_fail("format.basic.texelBlockDimension3 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23e,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  uVar4 = (uint)(uVar19 >> 0x20) & 0xff;
  uVar26 = uVar4 + 1;
  if ((ulong)(uVar8 * height * width) / (ulong)uVar26 != size) {
    __assert_fail("size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23f,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  y0Bits = 0;
  uBits = 0;
  if (psVar16 != psVar25) {
    uVar17 = 0;
    uVar34 = 0;
    uVar27 = 0;
    uVar19 = 0;
    uVar23 = 0;
    uVar30 = 0;
    local_240 = 0;
    uVar22 = 0;
    uVar24 = 0;
    local_230 = 0;
    uVar14 = 0;
    uVar28 = 0;
    do {
      uVar13 = *(ulong *)psVar16;
      uVar20 = (uint)(uVar13 >> 0x18) & 0xf;
      uVar29 = (uint)(uVar13 >> 0x20);
      uVar21 = (uint)(uVar13 >> 0x10);
      local_24c = uVar12;
      if (uVar20 == 2) {
        uVar19 = uVar13 & 0xffff;
        uVar23 = (uVar21 & 0xff) + 1;
        uVar30 = uVar29 & 0xff;
      }
      else if (uVar20 == 1) {
        uVar34 = uVar13 & 0xffff;
        uVar17 = (uVar21 & 0xff) + 1;
        uVar27 = uVar29 & 0xff;
        uBits = uVar17;
      }
      else {
        if ((uVar13 & 0xf000000) != 0) {
          __assert_fail("false && \"Unsupported channel type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x268,
                        "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                       );
        }
        uVar21 = (uVar21 & 0xff) + 1;
        if (uVar28 == 0) {
          uVar14 = uVar29 & 0xff;
          uVar28 = uVar21;
          y0Bits = uVar21;
          local_240 = uVar13 & 0xffff;
        }
        else {
          uVar22 = uVar29 & 0xff;
          local_230 = uVar13 & 0xffff;
          uVar24 = uVar21;
        }
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar25);
    uVar21 = uVar24;
    uVar20 = uVar22;
    local_200 = (int)local_230;
    iVar5 = (int)local_240;
    if (uVar22 < uVar14) {
      uVar21 = uVar28;
      uVar20 = uVar14;
      uVar28 = uVar24;
      uVar14 = uVar22;
      y0Bits = uVar24;
      local_200 = (int)local_240;
      iVar5 = (int)local_230;
    }
    local_230._0_4_ = iVar5;
    if (uVar18 == uVar28) {
      if (uVar18 != uVar21) {
        __assert_fail("precision == y1Bits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x273,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar18 != uVar17) {
        __assert_fail("precision == uBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x274,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar18 != uVar23) {
        __assert_fail("precision == vBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x275,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      positionY0 = (float)(uVar14 * uVar26) * 0.00390625;
      positionY1 = (float)(uVar20 * uVar26) * 0.00390625;
      positionU = (float)(uVar27 * uVar26) * 0.00390625;
      blockSize = (float)uVar26;
      positionV = (float)(uVar30 * uVar26) * 0.00390625;
      std::vector<char,_std::allocator<char>_>::vector
                (&unpackedData,(ulong)(height * width * uVar12),(allocator_type *)&setPixel);
      local_1b0 = (ulong)width / (ulong)uVar26;
      if (height != 0) {
        iVar5 = (int)local_1b0;
        fVar35 = (float)~(-2 << (bVar31 & 0x1f));
        local_250 = 0;
        do {
          if (uVar4 < width) {
            iVar15 = local_250 * (int)local_1b0;
            iVar9 = local_250 * width;
            uVar13 = 0;
            do {
              pcVar7 = unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar10 = (int)uVar13;
              iVar11 = iVar10 + -1;
              if (iVar10 == 0) {
                iVar11 = 0;
              }
              uVar1 = uVar13 + 1;
              uVar12 = (uint)uVar1;
              if (uVar13 == iVar5 - 1U) {
                uVar12 = iVar5 - 1U;
              }
              if (0x1f < uVar33) {
LAB_0018e959:
                __assert_fail("numBits <= sizeof(T) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0x8d,
                              "T imageio::extract_bits(const void *, uint32_t, uint32_t) [T = unsigned int]"
                             );
              }
              uVar26 = (iVar11 + iVar15) * uVar8;
              uVar24 = (iVar15 + iVar10) * uVar8;
              uVar22 = (uVar12 + iVar15) * uVar8;
              iVar11 = iVar9 + iVar10 * 2;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar32 = 0;
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(local_200 + uVar12 >> 3) + (ulong)uVar26] >>
                     (local_200 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
              valueLeftY1 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar35;
              if (0x20 < uBits) goto LAB_0018e959;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uBits == 0) {
LAB_0018e936:
                __assert_fail("numBits > 0 && numBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xcd,"float imageio::convertUNORMToFloat(uint32_t, uint32_t)");
              }
              uVar12 = 0;
              do {
                iVar10 = (int)uVar34;
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(iVar10 + uVar12 >> 3) + (ulong)uVar26] >>
                     (iVar10 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uBits != uVar12);
              fVar36 = (float)~(-1 << ((byte)uBits & 0x1f));
              valueLeftU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar36;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                iVar6 = (int)uVar19;
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(uVar12 + iVar6 >> 3) + (ulong)uVar26] >>
                     (uVar12 + iVar6 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
              valueLeftV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar35;
              if (0x20 < y0Bits) goto LAB_0018e959;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (y0Bits == 0) goto LAB_0018e936;
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)((int)local_230 + uVar12 >> 3) + (ulong)uVar24] >>
                     ((int)local_230 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (y0Bits != uVar12);
              fVar37 = (float)~(-1 << ((byte)y0Bits & 0x1f));
              valueY0 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar37;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(local_200 + uVar12 >> 3) + (ulong)uVar24] >>
                     (local_200 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
              valueY1 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar35;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(iVar10 + uVar12 >> 3) + (ulong)uVar24] >>
                     (iVar10 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uBits != uVar12);
              valueU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar36;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(uVar12 + iVar6 >> 3) + (ulong)uVar24] >>
                     (uVar12 + iVar6 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
              valueV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar35;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(uVar12 + (int)local_230 >> 3) + (ulong)uVar22] >>
                     (uVar12 + (int)local_230 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (y0Bits != uVar12);
              valueRightY0 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar37;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(iVar10 + uVar12 >> 3) + (ulong)uVar22] >>
                     (iVar10 + uVar12 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uBits != uVar12);
              valueRightU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar36;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              uVar12 = 0;
              do {
                bVar31 = (byte)(1 << ((byte)uVar12 & 7));
                if (((byte)data[(ulong)(uVar12 + iVar6 >> 3) + (ulong)uVar22] >>
                     (uVar12 + iVar6 & 7) & 1) == 0) {
                  bVar31 = bVar32;
                }
                pbVar2 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar12 >> 3));
                *pbVar2 = *pbVar2 | bVar31;
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
              valueRightV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar35;
              setPixel.interpolateUV = &interpolateUV;
              setPixel.positionV = &positionV;
              setPixel.blockSize = &blockSize;
              setPixel.valueLeftV = &valueLeftV;
              setPixel.valueV = &valueV;
              setPixel.valueRightV = &valueRightV;
              setPixel.uBits = &uBits;
              setPixel.interpolateY = &interpolateY;
              setPixel.positionY1 = &positionY1;
              setPixel.valueLeftY1 = &valueLeftY1;
              setPixel.positionY0 = &positionY0;
              setPixel.valueY0 = &valueY0;
              setPixel.valueY1 = &valueY1;
              setPixel.valueRightY0 = &valueRightY0;
              setPixel.y0Bits = &y0Bits;
              setPixel.positionU = &positionU;
              setPixel.valueLeftU = &valueLeftU;
              setPixel.valueU = &valueU;
              setPixel.valueRightU = &valueRightU;
              setPixel.channelBytes = &channelBytes;
              unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
              ::$_0::operator()(&setPixel,
                                unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_start + iVar11 * local_24c,0.5);
              unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
              ::$_0::operator()(&setPixel,pcVar7 + (iVar11 + 1) * local_24c,1.5);
              uVar13 = uVar1;
            } while (uVar1 != iVar5 + (uint)(iVar5 == 0));
          }
          local_250 = local_250 + 1;
        } while (local_250 != height);
      }
      pcVar3 = (filepath->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar3,pcVar3 + filepath->_M_string_length);
      savePNG(this,&local_c0,appendExtension,VK_FORMAT_UNDEFINED,&unpackedFormat,width,height,
              unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (unpackedFormat.samples.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedFormat.samples.
                        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)unpackedFormat.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedFormat.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (unpackedFormat.extended.iccProfile.profile.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedFormat.extended.iccProfile.profile.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)unpackedFormat.extended.iccProfile.profile.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedFormat.extended.iccProfile.profile.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unpackedFormat.extended.iccProfile.name._M_dataplus._M_p !=
          &unpackedFormat.extended.iccProfile.name.field_2) {
        operator_delete(unpackedFormat.extended.iccProfile.name._M_dataplus._M_p,
                        unpackedFormat.extended.iccProfile.name.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  __assert_fail("precision == y0Bits",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                ,0x272,
                "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
               );
}

Assistant:

void CommandExtract::unpackAndSave422(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const char* data, std::size_t size) {
    (void) vkFormat;

    assert(format.model() == KHR_DF_MODEL_YUVSDA);
    assert(format.find(KHR_DF_CHANNEL_YUVSDA_Y));
    // Create a custom format with the same precision but with only 3 channels
    // Reuse similar 4 channel VkFormats and drop the last channel (There is no RGB variant of 10X6 and 12X4)
    const auto precision = format.find(KHR_DF_CHANNEL_YUVSDA_Y)->bitLength + 1u;
    auto unpackedFormat = createFormatDescriptor(
            precision == 8 ? VK_FORMAT_R8G8B8A8_UNORM :
            precision == 10 ? VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16 :
            precision == 12 ? VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16 :
            precision == 16 ? VK_FORMAT_R16G16B16A16_UNORM :
            VK_FORMAT_UNDEFINED, *this);
    unpackedFormat.removeLastChannel();

    // 1 pixel (block) with 4 channel is unpacked to 2 pixel with 3 channels: Y0,Y1,U,V -> R0,G0,B0,R1,G1,B1
    const auto blockYUVBytes = format.pixelByteCount();
    const auto blockDimensionX = format.basic.texelBlockDimension0 + 1;
    const auto blockDimensionY = format.basic.texelBlockDimension1 + 1;
    const auto pixelBytes = unpackedFormat.pixelByteCount();
    const auto channelBytes = pixelBytes / 3;
    assert(format.sampleCount() == 4);
    assert(format.basic.texelBlockDimension0 + 1 == 2);
    assert(format.basic.texelBlockDimension1 + 1 == 1);
    assert(format.basic.texelBlockDimension2 + 1 == 1);
    assert(format.basic.texelBlockDimension3 + 1 == 1);
    assert(size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY);
    (void) size;
    (void) blockDimensionY;

    uint32_t y0Offset = 0;
    uint32_t y0Bits = 0;
    uint32_t y0PositionX = 0;
    uint32_t y1Offset = 0;
    uint32_t y1Bits = 0;
    uint32_t y1PositionX = 0;
    uint32_t uOffset = 0;
    uint32_t uBits = 0;
    uint32_t uPositionX = 0;
    uint32_t vOffset = 0;
    uint32_t vBits = 0;
    uint32_t vPositionX = 0;

    for (const auto& sample : format.samples) {
        switch (sample.channelType) {
        case KHR_DF_CHANNEL_YUVSDA_Y:
            if (y0Bits != 0) {
                y1Offset = sample.bitOffset;
                y1Bits = sample.bitLength + 1;
                y1PositionX = sample.samplePosition0;
            } else {
                y0Offset = sample.bitOffset;
                y0Bits = sample.bitLength + 1;
                y0PositionX = sample.samplePosition0;
            }
            break;
        case KHR_DF_CHANNEL_YUVSDA_U:
            uOffset = sample.bitOffset;
            uBits = sample.bitLength + 1;
            uPositionX = sample.samplePosition0;
            break;
        case KHR_DF_CHANNEL_YUVSDA_V:
            vOffset = sample.bitOffset;
            vBits = sample.bitLength + 1;
            vPositionX = sample.samplePosition0;
            break;
        default:
            assert(false && "Unsupported channel type");
        }
    }
    if (y0PositionX > y1PositionX) {
        // Ensure that y0 (as we refer to) is the left sample
        std::swap(y0Offset, y1Offset);
        std::swap(y0Bits, y1Bits);
        std::swap(y0PositionX, y1PositionX);
    }

    assert(precision == y0Bits);
    assert(precision == y1Bits);
    assert(precision == uBits);
    assert(precision == vBits);

    const float positionY0 = static_cast<float>(y0PositionX * blockDimensionX) / 256.f;
    const float positionY1 = static_cast<float>(y1PositionX * blockDimensionX) / 256.f;
    const float positionU = static_cast<float>(uPositionX * blockDimensionX) / 256.f;
    const float positionV = static_cast<float>(vPositionX * blockDimensionX) / 256.f;
    const float blockSize = static_cast<float>(blockDimensionX);

    std::vector<char> unpackedData(width * height * pixelBytes);

    const auto blockCountX = width / blockDimensionX;
    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < blockCountX; x++) {
            const char* rawYUVBlockLeft = data + (y * blockCountX + (x == 0 ? 0 : x - 1)) * blockYUVBytes;
            const char* rawYUVBlock = data + (y * blockCountX + x) * blockYUVBytes;
            const char* rawYUVBlockRight = data + (y * blockCountX + (x == blockCountX - 1 ? blockCountX - 1 : x + 1)) * blockYUVBytes;

            char* pixel0 = unpackedData.data() + (y * width + x * 2) * pixelBytes;
            char* pixel1 = unpackedData.data() + (y * width + x * 2 + 1) * pixelBytes;

            const float valueLeftY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, y1Offset, y1Bits), y1Bits);
            const float valueLeftU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, uOffset, uBits), uBits);
            const float valueLeftV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, vOffset, vBits), vBits);
            const float valueY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y0Offset, y0Bits), y0Bits);
            const float valueY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y1Offset, y1Bits), y1Bits);
            const float valueU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, uOffset, uBits), uBits);
            const float valueV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, vOffset, vBits), vBits);
            const float valueRightY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, y0Offset, y0Bits), y0Bits);
            const float valueRightU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, uOffset, uBits), uBits);
            const float valueRightV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, vOffset, vBits), vBits);

            const auto interpolateY = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2, float pos3, float value3) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else if (pos < pos2)
                    return remap(pos, pos1, pos2, value1, value2);
                else
                    return remap(pos, pos2, pos3, value2, value3);
            };

            const auto interpolateUV = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else
                    return remap(pos, pos1, pos2, value1, value2);
            };

            const auto setPixel = [&](auto* pixel, float pos) {
                const auto r = convertFloatToUNORM(interpolateUV(pos,
                        positionV - blockSize, valueLeftV,
                        positionV, valueV,
                        positionV + blockSize, valueRightV), uBits);
                const auto g = convertFloatToUNORM(interpolateY(
                        pos,
                        positionY1 - blockSize, valueLeftY1,
                        positionY0, valueY0,
                        positionY1, valueY1,
                        positionY0 + blockSize, valueRightY0), y0Bits);
                const auto b = convertFloatToUNORM(interpolateUV(pos,
                        positionU - blockSize, valueLeftU,
                        positionU, valueU,
                        positionU + blockSize, valueRightU), uBits);

                const auto offsetToUsedBytes = is_big_endian ? sizeof(r) - channelBytes : 0u;
                std::memcpy(pixel + 0 * channelBytes, &r + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 1 * channelBytes, &g + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 2 * channelBytes, &b + offsetToUsedBytes, channelBytes);
            };

            setPixel(pixel0, 0.5f);
            setPixel(pixel1, 1.5f);
        }
    }

    // Save unpacked data as RGBSDA with the custom format
    savePNG(filepath, appendExtension, VK_FORMAT_UNDEFINED, unpackedFormat, width, height,
            reinterpret_cast<const char*>(unpackedData.data()),
            unpackedData.size() * sizeof(decltype(unpackedData)::value_type));
}